

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * CreateLiteralCopy(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  _func_int **pp_Var1;
  TypeBase *pTVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined **ppuVar5;
  undefined1 uVar6;
  ExprIntegerLiteral *node;
  undefined4 extraout_var;
  
  if (value != (ExprBase *)0x0) {
    switch(value->typeID) {
    case 3:
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar3);
      pTVar2 = value->type;
      uVar6 = value->field_0x29;
      pEVar4->typeID = 3;
      pEVar4->source = source;
      pEVar4->type = pTVar2;
      pEVar4->next = (ExprBase *)0x0;
      pEVar4->listed = false;
      ppuVar5 = &PTR__ExprBase_002234a0;
      break;
    case 4:
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar4 = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
      pTVar2 = value->type;
      uVar6 = value->field_0x29;
      pEVar4->typeID = 4;
      pEVar4->source = source;
      pEVar4->type = pTVar2;
      pEVar4->next = (ExprBase *)0x0;
      pEVar4->listed = false;
      ppuVar5 = &PTR__ExprBase_002234d8;
      break;
    default:
      goto switchD_0014bb73_caseD_5;
    case 6:
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar4 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
      pTVar2 = value->type;
      pp_Var1 = value[1]._vptr_ExprBase;
      pEVar4->typeID = 6;
      pEVar4->source = source;
      pEVar4->type = pTVar2;
      pEVar4->next = (ExprBase *)0x0;
      pEVar4->listed = false;
      pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
      pEVar4[1]._vptr_ExprBase = pp_Var1;
      return pEVar4;
    case 7:
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar4 = (ExprBase *)CONCAT44(extraout_var_01,iVar3);
      pTVar2 = value->type;
      pp_Var1 = value[1]._vptr_ExprBase;
      pEVar4->typeID = 7;
      pEVar4->source = source;
      pEVar4->type = pTVar2;
      pEVar4->next = (ExprBase *)0x0;
      pEVar4->listed = false;
      pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223548;
      pEVar4[1]._vptr_ExprBase = pp_Var1;
      return pEVar4;
    }
    pEVar4->_vptr_ExprBase = (_func_int **)ppuVar5;
    pEVar4->field_0x29 = uVar6;
    return pEVar4;
  }
switchD_0014bb73_caseD_5:
  anon_unknown.dwarf_9c70f::Stop(ctx,source,"ERROR: unknown literal type");
}

Assistant:

ExprBase* CreateLiteralCopy(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(ExprBoolLiteral *node = getType<ExprBoolLiteral>(value))
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, node->type, node->value);

	if(ExprCharacterLiteral *node = getType<ExprCharacterLiteral>(value))
		return new (ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(source, node->type, node->value);

	if(ExprIntegerLiteral *node = getType<ExprIntegerLiteral>(value))
		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, node->type, node->value);

	if(ExprRationalLiteral *node = getType<ExprRationalLiteral>(value))
		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, node->type, node->value);

	Stop(ctx, source, "ERROR: unknown literal type");

	return NULL;
}